

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_20661e::CommandLineParser::ResetAllOptionOccurrences(CommandLineParser *this)

{
  uint uVar1;
  StringMapEntryBase **ppSVar2;
  SubCommand *pSVar3;
  void **ppvVar4;
  SmallPtrSetIteratorImpl SVar5;
  iterator iVar6;
  iterator __begin2;
  iterator __begin1;
  StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
  local_40;
  SmallPtrSetIteratorImpl local_38;
  
  SVar5 = (SmallPtrSetIteratorImpl)
          llvm::SmallPtrSetImpl<llvm::cl::SubCommand_*>::begin
                    (&(this->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>);
  local_38 = SVar5;
  iVar6 = llvm::SmallPtrSetImpl<llvm::cl::SubCommand_*>::end
                    (&(this->RegisteredSubCommands).super_SmallPtrSetImpl<llvm::cl::SubCommand_*>);
  ppvVar4 = SVar5.Bucket;
  while (ppvVar4 != iVar6.super_SmallPtrSetIteratorImpl.Bucket) {
    pSVar3 = llvm::SmallPtrSetIterator<llvm::cl::SubCommand_*>::operator*
                       ((SmallPtrSetIterator<llvm::cl::SubCommand_*> *)&local_38);
    local_40.Ptr = (StringMapEntryBase **)
                   llvm::StringMap<llvm::cl::Option_*,_llvm::MallocAllocator>::begin
                             (&pSVar3->OptionsMap);
    uVar1 = (pSVar3->OptionsMap).super_StringMapImpl.NumBuckets;
    ppSVar2 = (pSVar3->OptionsMap).super_StringMapImpl.TheTable;
    while (local_40.Ptr != ppSVar2 + uVar1) {
      *(undefined4 *)((*local_40.Ptr)[1].StrLen + 8) = 0;
      llvm::
      StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
      ::operator++(&local_40);
    }
    llvm::SmallPtrSetIterator<llvm::cl::SubCommand_*>::operator++
              ((SmallPtrSetIterator<llvm::cl::SubCommand_*> *)&local_38);
    ppvVar4 = local_38.Bucket;
  }
  return;
}

Assistant:

void CommandLineParser::ResetAllOptionOccurrences() {
  // So that we can parse different command lines multiple times in succession
  // we reset all option values to look like they have never been seen before.
  for (auto SC : RegisteredSubCommands) {
    for (auto &O : SC->OptionsMap)
      O.second->reset();
  }
}